

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resample.c
# Opt level: O0

char * speex_resampler_strerror(int err)

{
  int err_local;
  char *local_8;
  
  switch(err) {
  case 0:
    local_8 = "Success.";
    break;
  case 1:
    local_8 = "Memory allocation failed.";
    break;
  case 2:
    local_8 = "Bad resampler state.";
    break;
  case 3:
    local_8 = "Invalid argument.";
    break;
  case 4:
    local_8 = "Input and output buffers overlap.";
    break;
  default:
    local_8 = "Unknown error. Bad error code or strange version mismatch.";
  }
  return local_8;
}

Assistant:

EXPORT const char *speex_resampler_strerror(int err)
{
   switch (err)
   {
      case RESAMPLER_ERR_SUCCESS:
         return "Success.";
      case RESAMPLER_ERR_ALLOC_FAILED:
         return "Memory allocation failed.";
      case RESAMPLER_ERR_BAD_STATE:
         return "Bad resampler state.";
      case RESAMPLER_ERR_INVALID_ARG:
         return "Invalid argument.";
      case RESAMPLER_ERR_PTR_OVERLAP:
         return "Input and output buffers overlap.";
      default:
         return "Unknown error. Bad error code or strange version mismatch.";
   }
}